

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O0

bool __thiscall POSG::SetInitialized(POSG *this,bool b)

{
  undefined8 uVar1;
  char *in_RDI;
  E *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,in_RDI);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  in_RDI[8] = '\x01';
  return true;
}

Assistant:

bool POSG::SetInitialized(bool b)
{
    if(_m_nrAgents == 0)
    {
        throw E("POSG::SetInitialized failed because POSG doesn't know the \
number of agents yet. (use SetNrAgents first!)");
    }

    //do some checks?
    _m_initialized = true;
    return(true);
}